

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smoothsort.h
# Opt level: O0

void __thiscall TLeonardoHeap<double>::heapify(TLeonardoHeap<double> *this,size_t root,size_t order)

{
  size_t local_30;
  size_t comp_order;
  size_t comp;
  size_t order_local;
  size_t root_local;
  TLeonardoHeap<double> *this_local;
  
  comp = order;
  order_local = root;
  while( true ) {
    if (comp < 2) {
      return;
    }
    if (this->data[order_local - 1] < this->data[(order_local - 1) - Leonardo_k[comp - 2]] ||
        this->data[order_local - 1] == this->data[(order_local - 1) - Leonardo_k[comp - 2]]) {
      comp_order = (order_local - 1) - Leonardo_k[comp - 2];
      local_30 = comp - 1;
    }
    else {
      comp_order = order_local - 1;
      local_30 = comp - 2;
    }
    if (this->data[comp_order] < this->data[order_local] ||
        this->data[comp_order] == this->data[order_local]) break;
    swap(this,order_local,comp_order);
    order_local = comp_order;
    comp = local_30;
  }
  return;
}

Assistant:

inline void TLeonardoHeap<T>::heapify(size_t root, size_t order) {
	size_t comp, comp_order;
	while(true) {
		if(order <= 1) { break; }	// Break if root is a singleton node
		
		// Determine which of the two children is greater
		if(data[root-1] > data[root-1-Leonardo_k[order-2]]) {
			comp = root-1;
			comp_order = order-2;
		} else {
			comp = root-1-Leonardo_k[order-2];
			comp_order = order-1;
		}
		
		// Compare the root with the greater of the two children
		if(data[comp] > data[root]) { swap(root, comp); } else { break; }
		
		// shift the root downwards
		root = comp;
		order = comp_order;
	}
}